

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

char * TextReplace(char *text,char *replace,char *by)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char *__dest;
  int iVar7;
  
  if (by != (char *)0x0 && (replace != (char *)0x0 && text != (char *)0x0)) {
    uVar1 = TextLength(replace);
    iVar7 = 0;
    if (uVar1 != 0) {
      uVar2 = TextLength(by);
      iVar6 = 1;
      pcVar4 = text;
      while (pcVar4 = strstr(pcVar4,replace), pcVar4 != (char *)0x0) {
        pcVar4 = pcVar4 + (int)uVar1;
        iVar7 = iVar7 + -1;
        iVar6 = iVar6 + (uVar2 - uVar1);
      }
      uVar3 = TextLength(text);
      pcVar4 = (char *)malloc((ulong)(iVar6 + uVar3));
      if (pcVar4 != (char *)0x0) {
        __dest = pcVar4;
        for (; iVar7 != 0; iVar7 = iVar7 + 1) {
          pcVar5 = strstr(text,replace);
          iVar6 = (int)pcVar5 - (int)text;
          strncpy(__dest,text,(long)iVar6);
          strcpy(__dest + iVar6,by);
          __dest = __dest + iVar6 + (int)uVar2;
          text = text + (int)(iVar6 + uVar1);
        }
        strcpy(__dest,text);
        return pcVar4;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *TextReplace(char *text, const char *replace, const char *by)
{
    // Sanity checks and initialization
    if (!text || !replace || !by) return NULL;

    char *result;

    char *insertPoint;      // Next insert point
    char *temp;             // Temp pointer
    int replaceLen;         // Replace string length of (the string to remove)
    int byLen;              // Replacement length (the string to replace replace by)
    int lastReplacePos;     // Distance between replace and end of last replace
    int count;              // Number of replacements

    replaceLen = TextLength(replace);
    if (replaceLen == 0) return NULL;  // Empty replace causes infinite loop during count

    byLen = TextLength(by);

    // Count the number of replacements needed
    insertPoint = text;
    for (count = 0; (temp = strstr(insertPoint, replace)); count++) insertPoint = temp + replaceLen;

    // Allocate returning string and point temp to it
    temp = result = RL_MALLOC(TextLength(text) + (byLen - replaceLen)*count + 1);

    if (!result) return NULL;   // Memory could not be allocated

    // First time through the loop, all the variable are set correctly from here on,
    //    temp points to the end of the result string
    //    insertPoint points to the next occurrence of replace in text
    //    text points to the remainder of text after "end of replace"
    while (count--)
    {
        insertPoint = strstr(text, replace);
        lastReplacePos = (int)(insertPoint - text);
        temp = strncpy(temp, text, lastReplacePos) + lastReplacePos;
        temp = strcpy(temp, by) + byLen;
        text += lastReplacePos + replaceLen; // Move to next "end of replace"
    }

    // Copy remaind text part after replacement to result (pointed by moving temp)
    strcpy(temp, text);

    return result;
}